

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O1

int XMLSearch_search_get_attribute_index(XMLSearch *search,SXML_CHAR *attr_name)

{
  int iVar1;
  int iVar2;
  long lVar3;
  XMLAttribute *pXVar4;
  
  if (((attr_name != (SXML_CHAR *)0x0 && search != (XMLSearch *)0x0) && (*attr_name != '\0')) &&
     (iVar1 = search->n_attributes, 0 < (long)iVar1)) {
    pXVar4 = search->attributes;
    lVar3 = 0;
    do {
      iVar2 = strcmp(pXVar4->name,attr_name);
      if (iVar2 == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pXVar4 = pXVar4 + 1;
    } while (iVar1 != lVar3);
  }
  return -1;
}

Assistant:

int XMLSearch_search_get_attribute_index(const XMLSearch* search, const SXML_CHAR* attr_name)
{
	int i;

	if (search == NULL || attr_name == NULL || attr_name[0] == NULC)
		return -1;

	for (i = 0; i < search->n_attributes; i++) {
		if (!sx_strcmp(search->attributes[i].name, attr_name))
			return i;
	}

	return -1;
}